

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_erl_generator.cc
# Opt level: O2

void __thiscall t_erl_generator::init_generator(t_erl_generator *this)

{
  ofstream_with_content_based_conditional_update *this_00;
  ofstream_with_content_based_conditional_update *this_01;
  int iVar1;
  int *piVar2;
  ostream *poVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  char *__rhs;
  int __oflag;
  int __oflag_00;
  int __oflag_01;
  int __oflag_02;
  t_erl_generator *ptVar4;
  string *psVar5;
  string f_consts_name;
  undefined1 local_130 [32];
  string f_consts_hrl_name;
  string program_module_name;
  string f_types_hrl_name;
  string f_types_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  (*(this->super_t_generator)._vptr_t_generator[0x1b])(&program_module_name,this);
  iVar1 = mkdir(program_module_name._M_dataplus._M_p,0x1ff);
  std::__cxx11::string::~string((string *)&program_module_name);
  if (iVar1 == -1) {
    piVar2 = __errno_location();
    if (*piVar2 != 0x11) {
      __return_storage_ptr__ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           __cxa_allocate_exception(0x20);
      (*(this->super_t_generator)._vptr_t_generator[0x1b])(&f_types_hrl_name,this);
      std::__cxx11::string::string
                ((string *)&f_types_name,f_types_hrl_name._M_dataplus._M_p,
                 (allocator *)&f_consts_name);
      std::operator+(&program_module_name,&f_types_name,": ");
      __rhs = strerror(*piVar2);
      std::operator+(__return_storage_ptr__,&program_module_name,__rhs);
      __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,
                  std::__cxx11::string::~string);
    }
  }
  this->export_lines_first_ = true;
  this->export_types_lines_first_ = true;
  std::__cxx11::string::string
            ((string *)&local_50,(string *)&(this->super_t_generator).program_name_);
  make_safe_for_module_name(&program_module_name,this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  (*(this->super_t_generator)._vptr_t_generator[0x1b])(&f_consts_name,this);
  std::operator+(&f_types_hrl_name,&f_consts_name,&program_module_name);
  std::operator+(&f_types_name,&f_types_hrl_name,"_types.erl");
  std::__cxx11::string::~string((string *)&f_types_hrl_name);
  std::__cxx11::string::~string((string *)&f_consts_name);
  (*(this->super_t_generator)._vptr_t_generator[0x1b])(&f_consts_hrl_name,this);
  std::operator+(&f_consts_name,&f_consts_hrl_name,&program_module_name);
  std::operator+(&f_types_hrl_name,&f_consts_name,"_types.hrl");
  std::__cxx11::string::~string((string *)&f_consts_name);
  std::__cxx11::string::~string((string *)&f_consts_hrl_name);
  std::__cxx11::string::string
            ((string *)&f_consts_name,f_types_name._M_dataplus._M_p,(allocator *)&f_consts_hrl_name)
  ;
  this_00 = &this->f_types_file_;
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::open
            (this_00,(char *)&f_consts_name,__oflag);
  std::__cxx11::string::~string((string *)&f_consts_name);
  std::__cxx11::string::string
            ((string *)&f_consts_name,f_types_hrl_name._M_dataplus._M_p,
             (allocator *)&f_consts_hrl_name);
  this_01 = &this->f_types_hrl_file_;
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::open
            (this_01,(char *)&f_consts_name,__oflag_00);
  std::__cxx11::string::~string((string *)&f_consts_name);
  std::operator+(&local_70,&program_module_name,"_types");
  ptVar4 = (t_erl_generator *)this_01;
  hrl_header(this,(ostream *)this_01,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  erl_autogen_comment_abi_cxx11_(&f_consts_name,ptVar4);
  poVar3 = std::operator<<((ostream *)this_00,(string *)&f_consts_name);
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  poVar3 = std::operator<<(poVar3,"-module(");
  poVar3 = std::operator<<(poVar3,(string *)&program_module_name);
  poVar3 = std::operator<<(poVar3,"_types).");
  psVar5 = &::endl_abi_cxx11_;
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  erl_imports_abi_cxx11_(&f_consts_hrl_name,(t_erl_generator *)psVar5);
  poVar3 = std::operator<<(poVar3,(string *)&f_consts_hrl_name);
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&f_consts_hrl_name);
  std::__cxx11::string::~string((string *)&f_consts_name);
  poVar3 = std::operator<<((ostream *)this_00,"-include(\"");
  poVar3 = std::operator<<(poVar3,(string *)&program_module_name);
  poVar3 = std::operator<<(poVar3,"_types.hrl\").");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  render_includes_abi_cxx11_(&f_consts_name,this);
  poVar3 = std::operator<<((ostream *)this_01,(string *)&f_consts_name);
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&f_consts_name);
  (*(this->super_t_generator)._vptr_t_generator[0x1b])(local_130,this);
  std::operator+(&f_consts_hrl_name,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_130,
                 &program_module_name);
  std::operator+(&f_consts_name,&f_consts_hrl_name,"_constants.erl");
  std::__cxx11::string::~string((string *)&f_consts_hrl_name);
  std::__cxx11::string::~string((string *)local_130);
  (*(this->super_t_generator)._vptr_t_generator[0x1b])(&stack0xffffffffffffff30,this);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_130,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &stack0xffffffffffffff30,&program_module_name);
  std::operator+(&f_consts_hrl_name,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_130,
                 "_constants.hrl");
  std::__cxx11::string::~string((string *)local_130);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff30);
  std::__cxx11::string::string
            ((string *)local_130,f_consts_name._M_dataplus._M_p,
             (allocator *)&stack0xffffffffffffff30);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::open
            (&this->f_consts_file_,local_130,__oflag_01);
  std::__cxx11::string::~string((string *)local_130);
  std::__cxx11::string::string
            ((string *)local_130,f_consts_hrl_name._M_dataplus._M_p,
             (allocator *)&stack0xffffffffffffff30);
  ptVar4 = (t_erl_generator *)local_130;
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::open
            (&this->f_consts_hrl_file_,(char *)ptVar4,__oflag_02);
  std::__cxx11::string::~string((string *)local_130);
  erl_autogen_comment_abi_cxx11_((string *)local_130,ptVar4);
  poVar3 = std::operator<<((ostream *)&this->f_consts_file_,(string *)local_130);
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  poVar3 = std::operator<<(poVar3,"-module(");
  poVar3 = std::operator<<(poVar3,(string *)&program_module_name);
  poVar3 = std::operator<<(poVar3,"_constants).");
  psVar5 = &::endl_abi_cxx11_;
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  erl_imports_abi_cxx11_((string *)&stack0xffffffffffffff30,(t_erl_generator *)psVar5);
  poVar3 = std::operator<<(poVar3,(string *)&stack0xffffffffffffff30);
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  poVar3 = std::operator<<(poVar3,"-include(\"");
  poVar3 = std::operator<<(poVar3,(string *)&program_module_name);
  poVar3 = std::operator<<(poVar3,"_types.hrl\").");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  psVar5 = &::endl_abi_cxx11_;
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff30);
  std::__cxx11::string::~string((string *)local_130);
  erl_autogen_comment_abi_cxx11_((string *)local_130,(t_erl_generator *)psVar5);
  poVar3 = std::operator<<((ostream *)&this->f_consts_hrl_file_,(string *)local_130);
  psVar5 = &::endl_abi_cxx11_;
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  erl_imports_abi_cxx11_((string *)&stack0xffffffffffffff30,(t_erl_generator *)psVar5);
  poVar3 = std::operator<<(poVar3,(string *)&stack0xffffffffffffff30);
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  poVar3 = std::operator<<(poVar3,"-include(\"");
  poVar3 = std::operator<<(poVar3,(string *)&program_module_name);
  poVar3 = std::operator<<(poVar3,"_types.hrl\").");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff30);
  std::__cxx11::string::~string((string *)local_130);
  std::__cxx11::string::~string((string *)&f_consts_hrl_name);
  std::__cxx11::string::~string((string *)&f_consts_name);
  std::__cxx11::string::~string((string *)&f_types_hrl_name);
  std::__cxx11::string::~string((string *)&f_types_name);
  std::__cxx11::string::~string((string *)&program_module_name);
  return;
}

Assistant:

void t_erl_generator::init_generator() {
  // Make output directory
  MKDIR(get_out_dir().c_str());

  // setup export lines
  export_lines_first_ = true;
  export_types_lines_first_ = true;

  string program_module_name = make_safe_for_module_name(program_name_);

  // types files
  string f_types_name = get_out_dir() + program_module_name + "_types.erl";
  string f_types_hrl_name = get_out_dir() + program_module_name + "_types.hrl";

  f_types_file_.open(f_types_name.c_str());
  f_types_hrl_file_.open(f_types_hrl_name.c_str());

  hrl_header(f_types_hrl_file_, program_module_name + "_types");

  f_types_file_ << erl_autogen_comment() << endl
                << "-module(" << program_module_name << "_types)." << endl
                << erl_imports() << endl;

  f_types_file_ << "-include(\"" << program_module_name << "_types.hrl\")." << endl
                  << endl;

  f_types_hrl_file_ << render_includes() << endl;

  // consts files
  string f_consts_name = get_out_dir() + program_module_name + "_constants.erl";
  string f_consts_hrl_name = get_out_dir() + program_module_name + "_constants.hrl";

  f_consts_file_.open(f_consts_name.c_str());
  f_consts_hrl_file_.open(f_consts_hrl_name.c_str());

  f_consts_file_ << erl_autogen_comment() << endl
                 << "-module(" << program_module_name << "_constants)." << endl
                 << erl_imports() << endl
                 << "-include(\"" << program_module_name << "_types.hrl\")." << endl
                 << endl;

  f_consts_hrl_file_ << erl_autogen_comment() << endl << erl_imports() << endl
                     << "-include(\"" << program_module_name << "_types.hrl\")." << endl << endl;
}